

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O2

int Abc_NtkRenodeEvalBdd(If_Man_t *p,If_Cut_t *pCut)

{
  long lVar1;
  byte bVar2;
  DdManager *dd;
  int iVar3;
  uint *pTruth;
  DdNode *n;
  DdNode *n_00;
  char cVar4;
  ulong uVar5;
  int pOrder [32];
  int local_b8 [34];
  
  bVar2 = pCut->field_0x1f;
  lVar1 = (ulong)bVar2 * 4;
  for (uVar5 = 0; dd = s_pDd, bVar2 != uVar5; uVar5 = uVar5 + 1) {
    local_b8[uVar5] = -100;
    *(undefined1 *)((long)&pCut[1].Area + uVar5 + lVar1) = 0x9c;
  }
  pTruth = If_CutTruth(p,pCut);
  n = Kit_TruthToBdd(dd,pTruth,(uint)(byte)pCut->field_0x1f,0);
  Cudd_Ref(n);
  n_00 = Extra_Reorder(s_pReo,s_pDd,n,local_b8);
  Cudd_Ref(n_00);
  bVar2 = pCut->field_0x1f;
  cVar4 = '\0';
  for (uVar5 = 0; uVar5 < bVar2; uVar5 = uVar5 + 1) {
    if (-1 < (long)local_b8[uVar5]) {
      cVar4 = cVar4 + '\x01';
      *(char *)((long)&pCut[1].Area + local_b8[uVar5] + lVar1) = cVar4;
    }
  }
  iVar3 = Cudd_DagSize(n_00);
  Cudd_RecursiveDeref(s_pDd,n_00);
  Cudd_RecursiveDeref(s_pDd,n);
  return iVar3 + -1;
}

Assistant:

int Abc_NtkRenodeEvalBdd( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int pOrder[IF_MAX_LUTSIZE];
    DdNode * bFunc, * bFuncNew;
    int i, k, nNodes;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = pOrder[i] = -100;
    bFunc = Kit_TruthToBdd( s_pDd, If_CutTruth(p, pCut), If_CutLeaveNum(pCut), 0 );  Cudd_Ref( bFunc );
    bFuncNew = Extra_Reorder( s_pReo, s_pDd, bFunc, pOrder );                     Cudd_Ref( bFuncNew );
    for ( i = k = 0; i < If_CutLeaveNum(pCut); i++ )
        if ( pOrder[i] >= 0 )
            pPerm[pOrder[i]] = ++k; // double-check this!
    nNodes = -1 + Cudd_DagSize( bFuncNew );
    Cudd_RecursiveDeref( s_pDd, bFuncNew );
    Cudd_RecursiveDeref( s_pDd, bFunc );
    return nNodes; 
}